

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall ON_Extrusion::Trim(ON_Extrusion *this,int dir,ON_Interval *domain)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool local_71;
  bool bChanged;
  double t1;
  double t0;
  double s1;
  double s0;
  ON_Interval dom;
  bool rc;
  ON_Interval *domain_local;
  int dir_local;
  ON_Extrusion *this_local;
  
  dom.m_t[1]._7_1_ = 0;
  bVar1 = ON_Interval::IsIncreasing(domain);
  if (bVar1) {
    domain_local._4_4_ = dir;
    if ((this->m_bTransposed & 1U) != 0) {
      domain_local._4_4_ = 1 - dir;
    }
    if (domain_local._4_4_ == 1) {
      dom.m_t[1]._7_1_ = ON_Interval::IsIncreasing(&this->m_path_domain);
      if (((bool)dom.m_t[1]._7_1_) &&
         (bVar1 = ON_Interval::operator!=(&this->m_path_domain,domain), bVar1)) {
        ON_Interval::ON_Interval((ON_Interval *)&s0);
        ON_Interval::Intersection((ON_Interval *)&s0,domain,&this->m_path_domain);
        dom.m_t[1]._7_1_ = ON_Interval::IsIncreasing((ON_Interval *)&s0);
        if ((bool)dom.m_t[1]._7_1_) {
          pdVar3 = ON_Interval::operator[]((ON_Interval *)&s0,0);
          dVar4 = ON_Interval::NormalizedParameterAt(&this->m_path_domain,*pdVar3);
          pdVar3 = ON_Interval::operator[]((ON_Interval *)&s0,1);
          dVar5 = ON_Interval::NormalizedParameterAt(&this->m_path_domain,*pdVar3);
          pdVar3 = ON_Interval::operator[](&this->m_t,0);
          dVar7 = *pdVar3;
          pdVar3 = ON_Interval::operator[](&this->m_t,1);
          dVar6 = (1.0 - dVar4) * dVar7 + dVar4 * *pdVar3;
          pdVar3 = ON_Interval::operator[](&this->m_t,0);
          dVar7 = *pdVar3;
          pdVar3 = ON_Interval::operator[](&this->m_t,1);
          dVar7 = (1.0 - dVar5) * dVar7 + dVar5 * *pdVar3;
          local_71 = false;
          if (((dVar4 < dVar5) && (local_71 = false, 0.0 <= dVar6)) &&
             (local_71 = false, dVar6 < dVar7)) {
            local_71 = dVar7 <= 1.0;
          }
          dom.m_t[1]._7_1_ = local_71;
          if (local_71 != false) {
            bVar1 = false;
            pdVar3 = ON_Interval::operator[](&this->m_t,0);
            if (((dVar6 != *pdVar3) || (NAN(dVar6) || NAN(*pdVar3))) && (0.0 < dVar6)) {
              bVar1 = true;
              pdVar3 = ON_Interval::operator[](&this->m_t,0);
              *pdVar3 = dVar6;
              this->m_bHaveN[0] = false;
            }
            pdVar3 = ON_Interval::operator[](&this->m_t,1);
            if (((dVar7 != *pdVar3) || (NAN(dVar7) || NAN(*pdVar3))) && (dVar7 < 1.0)) {
              bVar1 = true;
              pdVar3 = ON_Interval::operator[](&this->m_t,1);
              *pdVar3 = dVar7;
              this->m_bHaveN[1] = false;
            }
            if (bVar1) {
              (this->m_path_domain).m_t[0] = s0;
              (this->m_path_domain).m_t[1] = dom.m_t[0];
              ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
            }
          }
        }
      }
    }
    else if ((domain_local._4_4_ == 0) && (this->m_profile != (ON_Curve *)0x0)) {
      iVar2 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])
                        (this->m_profile,domain);
      dom.m_t[1]._7_1_ = -(char)iVar2 & 1;
      ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    }
    this_local._7_1_ = (bool)(dom.m_t[1]._7_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Extrusion::Trim(
       int dir,
       const ON_Interval& domain
       )
{
  bool rc = false;
  if (!domain.IsIncreasing())
    return false;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( 1 == dir )
  {
    rc = m_path_domain.IsIncreasing();
    if ( rc && m_path_domain != domain )
    {
      ON_Interval dom;
      dom.Intersection(domain,m_path_domain);
      rc = dom.IsIncreasing();
      if (rc)
      {
        double s0 = m_path_domain.NormalizedParameterAt(dom[0]);
        double s1 = m_path_domain.NormalizedParameterAt(dom[1]);
        double t0 = (1.0-s0)*m_t[0] + s0*m_t[1];
        double t1 = (1.0-s1)*m_t[0] + s1*m_t[1];
        rc = (s0 < s1 && 0.0 <= t0 && t0 < t1 && t1 <= 1.0);
        if (rc)
        {
          bool bChanged = false;
          if (t0 != m_t[0] && t0 > 0.0 )
          {
            bChanged = true;
            m_t[0] = t0;
            m_bHaveN[0] = false;
          }
          if ( t1 != m_t[1] && t1 < 1.0 )
          {
            bChanged = true;
            m_t[1] = t1;
            m_bHaveN[1] = false;
          }
          if ( bChanged )
          {
            m_path_domain = dom;
            DestroySurfaceTree();
          }
        }
      }
    }
  }
  else if ( 0 == dir )
  {
    if ( m_profile )
    {
      rc = m_profile->Trim(domain)?true:false;
      DestroySurfaceTree();
    }
  }
  return rc;
}